

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test.cc
# Opt level: O0

string * __thiscall
google::protobuf::util::UnredactedDebugFormatForTest_abi_cxx11_
          (string *__return_storage_ptr__,util *this,Message *message)

{
  undefined1 local_90 [8];
  Printer printer;
  Message *message_local;
  string *debug_string;
  
  printer.finder_._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::Printer((Printer *)local_90);
  TextFormat::Printer::SetExpandAny((Printer *)local_90,true);
  TextFormat::Printer::SetReportSensitiveFields((Printer *)local_90,kUnredactedDebugFormatForTest);
  TextFormat::Printer::PrintToString((Printer *)local_90,(Message *)this,__return_storage_ptr__);
  printer.finder_._7_1_ = 1;
  TextFormat::Printer::~Printer((Printer *)local_90);
  if ((printer.finder_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnredactedDebugFormatForTest(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetExpandAny(true);
  printer.SetReportSensitiveFields(
      internal::FieldReporterLevel::kUnredactedDebugFormatForTest);

  printer.PrintToString(message, &debug_string);

  return debug_string;
}